

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lexer.cpp
# Opt level: O3

expected<Miss2Identifier,_Miss2Identifier::Error> *
Miss2Identifier::match
          (expected<Miss2Identifier,_Miss2Identifier::Error> *__return_storage_ptr__,
          string_view *value,Options *options)

{
  long lVar1;
  char cVar2;
  int iVar3;
  size_type sVar4;
  value_type *__nptr;
  int *piVar5;
  value_type *pvVar6;
  size_type sVar7;
  size_type __n;
  long lVar8;
  bool bVar9;
  bool bVar10;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  anon_union_16_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_true>_3
  aVar12;
  undefined1 auVar13 [12];
  string_view local_78;
  char local_68;
  undefined7 uStack_67;
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
  local_60;
  anon_union_16_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_true>_3
  local_48;
  undefined8 local_38;
  
  sVar4 = value->__size;
  if (((sVar4 == 0) || (value->__data[sVar4 - 1] == ':')) ||
     ((cVar2 = *value->__data, (cVar2 == '_' & options->allow_underscore_identifiers) != 1 &&
      ((cVar2 != '$' && (0x19 < ((int)cVar2 & 0xffffffdfU) - 0x41)))))) {
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_error = InvalidIdentifier;
  }
  else {
    bVar9 = true;
    __n = 0xffffffffffffffff;
    lVar8 = 1;
    sVar7 = 0;
    do {
      cVar2 = value->__data[sVar7];
      if (cVar2 == '[') {
        bVar10 = __n != 0xffffffffffffffff;
        __n = sVar7;
        if (bVar10) {
          __return_storage_ptr__->has_value = false;
          (__return_storage_ptr__->contained).m_error = NestingOfArrays;
          return __return_storage_ptr__;
        }
      }
      else {
        if (cVar2 == ']') {
          bVar11 = libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::substr
                             (value,0,__n);
          aVar12._tail.field_0 =
               (_union<eggs::variants::detail::pack<unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_true>
                )libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::substr
                           (value,__n + 1,-(lVar8 + __n));
          if (!bVar9) {
            local_38 = 2;
            local_48._tail.field_0 = aVar12._tail.field_0;
LAB_00192d0a:
            local_68 = '\x01';
            local_78 = bVar11;
            eggs::variants::detail::
            _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
            ::_storage(&local_60,
                       (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
                        *)&local_48._tail);
            __return_storage_ptr__->has_value = true;
            (__return_storage_ptr__->contained).m_value.identifier = local_78;
            (__return_storage_ptr__->contained).m_value.index.
            super_OptionalBase<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char>_>_>
            .init_ = false;
            (__return_storage_ptr__->contained).m_value.index.
            super_OptionalBase<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char>_>_>
            .storage_.dummy_ = '\0';
            if (local_68 != '\x01') {
              return __return_storage_ptr__;
            }
            eggs::variants::detail::
            _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>,_false,_true>
            ::_storage(&(__return_storage_ptr__->contained).m_value.index.
                        super_OptionalBase<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char>_>_>
                        .storage_.value_._storage,&local_60);
            (__return_storage_ptr__->contained).m_value.index.
            super_OptionalBase<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char>_>_>
            .init_ = true;
            return __return_storage_ptr__;
          }
          local_78.__data = &local_68;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,aVar12._0_8_,aVar12._0_8_ + aVar12._8_8_);
          __nptr = local_78.__data;
          piVar5 = __errno_location();
          iVar3 = *piVar5;
          *piVar5 = 0;
          pvVar6 = (value_type *)strtol(__nptr,(char **)&local_48,10);
          if ((value_type *)local_48._0_8_ == __nptr) {
            std::__throw_invalid_argument("stoi");
          }
          else if (((value_type *)(long)(int)pvVar6 == pvVar6) && (*piVar5 != 0x22)) {
            if (*piVar5 == 0) {
              *piVar5 = iVar3;
            }
            if (local_78.__data != &local_68) {
              operator_delete(local_78.__data,CONCAT71(uStack_67,local_68) + 1);
            }
            if ((int)pvVar6 < 0) {
              __return_storage_ptr__->has_value = false;
              (__return_storage_ptr__->contained).m_error = NegativeIndex;
              return __return_storage_ptr__;
            }
            local_48._0_8_ = pvVar6;
            local_38 = 1;
            goto LAB_00192d0a;
          }
          auVar13 = std::__throw_out_of_range("stoi");
          if (auVar13._8_4_ == 1) {
            __cxa_begin_catch();
            __return_storage_ptr__->has_value = false;
            (__return_storage_ptr__->contained).m_error = OutOfRange;
            __cxa_end_catch();
            return __return_storage_ptr__;
          }
          _Unwind_Resume(auVar13._0_8_);
        }
        if (__n == 0xffffffffffffffff) {
          __n = 0xffffffffffffffff;
        }
        else if (9 < (byte)(cVar2 - 0x30U)) {
          bVar9 = (bool)(bVar9 & cVar2 == '-');
        }
      }
      sVar7 = sVar7 + 1;
      lVar1 = sVar4 + lVar8;
      lVar8 = lVar8 + -1;
    } while (lVar1 != 2);
    sVar4 = value->__size;
    (__return_storage_ptr__->contained).m_value.identifier.__data = value->__data;
    (__return_storage_ptr__->contained).m_value.identifier.__size = sVar4;
    __return_storage_ptr__->has_value = true;
    (__return_storage_ptr__->contained).m_value.index.
    super_OptionalBase<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char>_>_>
    .init_ = false;
    (__return_storage_ptr__->contained).m_value.index.
    super_OptionalBase<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char>_>_>
    .storage_.dummy_ = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

auto Miss2Identifier::match(const string_view& value, const Options& options) -> expected<Miss2Identifier, Error>
{
    size_t begin_index = std::string::npos;
    bool is_number_index = true;

    if(!Miss2Identifier::is_identifier(value, options))
        return make_unexpected(Miss2Identifier::InvalidIdentifier);

    for(size_t i = 0; i < value.size(); ++i)
    {
        if(value[i] == '[')
        {
            if(begin_index != std::string::npos)
                return make_unexpected(Miss2Identifier::NestingOfArrays);

            begin_index = i;
        }
        else if(value[i] == ']')
        {
            auto ident = value.substr(0, begin_index);
            auto index = value.substr(begin_index + 1, i - (begin_index + 1));
            try
            {
                using index_type = decltype(Miss2Identifier::index);
                if(is_number_index)
                {
                    int index_value = std::stoi(index.to_string());
                    if(index_value >= 0)
                        return Miss2Identifier{ ident, index_type(index_value) };
                    else
                        return make_unexpected(Miss2Identifier::NegativeIndex);
                }
                else
                    return Miss2Identifier{ ident, index_type(index) };
            }
            catch(const std::out_of_range&)
            {
                return make_unexpected(Miss2Identifier::OutOfRange);
            }
        }
        else if(begin_index != std::string::npos)
        {
            if(!((value[i] >= '0' && value[i] <= '9') || (value[i] == '-')))
                is_number_index = false;
        }
    }

    return Miss2Identifier{ value, nullopt };
}